

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

bool cs_impl::compare_if<std::pair<cs_impl::any,_cs_impl::any>,_true>::compare
               (pair<cs_impl::any,_cs_impl::any> *a,pair<cs_impl::any,_cs_impl::any> *b)

{
  bool bVar1;
  pair<cs_impl::any,_cs_impl::any> *in_RSI;
  pair<cs_impl::any,_cs_impl::any> *in_stack_ffffffffffffffe8;
  
  bVar1 = std::operator==(in_RSI,in_stack_ffffffffffffffe8);
  return bVar1;
}

Assistant:

static bool compare(const T &a, const T &b)
		{
			return a == b;
		}